

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

timediff_t Curl_pgrsLimitWaitTime(pgrs_dir *d,curl_off_t speed_limit,curltime now)

{
  undefined8 uVar1;
  undefined4 uVar2;
  long lVar3;
  timediff_t tVar4;
  timediff_t tVar5;
  long lVar6;
  curltime newer;
  curltime older;
  
  lVar3 = d->cur_size - (d->limit).start_size;
  if (lVar3 != 0 && speed_limit != 0) {
    if (lVar3 < 0x20c49ba5e353f7) {
      lVar6 = (lVar3 * 1000) / speed_limit;
    }
    else {
      lVar6 = 0x7fffffffffffffff;
      if (lVar3 / speed_limit < 0x20c49ba5e353f7) {
        lVar6 = (lVar3 / speed_limit) * 1000;
      }
    }
    uVar1 = (d->limit).start.tv_sec;
    uVar2 = (d->limit).start.tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(now._0_12_,0);
    newer.tv_usec = SUB124(now._0_12_,8);
    older._12_4_ = 0;
    tVar4 = Curl_timediff_ceil(newer,older);
    tVar5 = 0;
    if (lVar6 - tVar4 != 0 && tVar4 <= lVar6) {
      tVar5 = lVar6 - tVar4;
    }
    return tVar5;
  }
  return 0;
}

Assistant:

timediff_t Curl_pgrsLimitWaitTime(struct pgrs_dir *d,
                                  curl_off_t speed_limit,
                                  struct curltime now)
{
  curl_off_t size = d->cur_size - d->limit.start_size;
  timediff_t minimum;
  timediff_t actual;

  if(!speed_limit || !size)
    return 0;

  /*
   * 'minimum' is the number of milliseconds 'size' should take to download to
   * stay below 'limit'.
   */
  if(size < CURL_OFF_T_MAX/1000)
    minimum = (timediff_t) (CURL_OFF_T_C(1000) * size / speed_limit);
  else {
    minimum = (timediff_t) (size / speed_limit);
    if(minimum < TIMEDIFF_T_MAX/1000)
      minimum *= 1000;
    else
      minimum = TIMEDIFF_T_MAX;
  }

  /*
   * 'actual' is the time in milliseconds it took to actually download the
   * last 'size' bytes.
   */
  actual = Curl_timediff_ceil(now, d->limit.start);
  if(actual < minimum) {
    /* if it downloaded the data faster than the limit, make it wait the
       difference */
    return (minimum - actual);
  }

  return 0;
}